

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O2

JSON_Value * jag_FindFirstNonNull(JSON_Array *pArr,initializer_list<unsigned_long> aIdx)

{
  JSON_Value_Type JVar1;
  JSON_Value *value;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    if (aIdx._M_len << 3 == lVar2) {
      return (JSON_Value *)0x0;
    }
    value = json_array_get_value(pArr,*(size_t *)((long)aIdx._M_array + lVar2));
    if ((value != (JSON_Value *)0x0) && (JVar1 = json_value_get_type(value), JVar1 != 1)) break;
    lVar2 = lVar2 + 8;
  }
  return value;
}

Assistant:

JSON_Value* jag_FindFirstNonNull(const JSON_Array* pArr, std::initializer_list<size_t> aIdx)
{
    for (size_t i: aIdx) {
        JSON_Value* pVal = json_array_get_value(pArr, i);
        if (pVal && json_value_get_type(pVal) != JSONNull)
            return pVal;
    }
    return nullptr;
}